

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

bool Js::JavascriptLibrary::InitializeTypedArrayConstructor
               (DynamicObject *typedArrayConstructor,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  Var value;
  JavascriptString *value_00;
  DynamicObject **ppDVar1;
  JavascriptLibrary *library;
  DeferredInitializeMode mode_local;
  DeferredTypeHandlerBase *typeHandler_local;
  DynamicObject *typedArrayConstructor_local;
  
  DeferredTypeHandlerBase::Convert(typeHandler,typedArrayConstructor,mode,5,0);
  this = RecyclableObject::GetLibrary(&typedArrayConstructor->super_RecyclableObject);
  value = TaggedInt::ToVarUnchecked(3);
  AddMember(this,typedArrayConstructor,0xd1,value,'\x02');
  value_00 = CreateStringFromCppLiteral<11ul>(this,(char16 (*) [11])L"TypedArray");
  AddMember(this,typedArrayConstructor,0x106,value_00,'\x02');
  ppDVar1 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).typedArrayPrototype);
  AddMember(this,typedArrayConstructor,0x124,*ppDVar1,'\0');
  AddFunctionToLibraryObject
            (this,typedArrayConstructor,0x95,(FunctionInfo *)Js::TypedArrayBase::EntryInfo::From,1,
             '\x06');
  AddFunctionToLibraryObject
            (this,typedArrayConstructor,0x11c,(FunctionInfo *)Js::TypedArrayBase::EntryInfo::Of,0,
             '\x06');
  AddSpeciesAccessorsToLibraryObject
            (this,typedArrayConstructor,
             (FunctionInfo *)Js::TypedArrayBase::EntryInfo::GetterSymbolSpecies);
  DynamicObject::SetHasNoEnumerableProperties(typedArrayConstructor,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeTypedArrayConstructor(DynamicObject* typedArrayConstructor, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(typedArrayConstructor, mode, 5);

        JavascriptLibrary* library = typedArrayConstructor->GetLibrary();

        library->AddMember(typedArrayConstructor, PropertyIds::length, TaggedInt::ToVarUnchecked(3), PropertyConfigurable);
        library->AddMember(typedArrayConstructor, PropertyIds::name, library->CreateStringFromCppLiteral(_u("TypedArray")), PropertyConfigurable);
        library->AddMember(typedArrayConstructor, PropertyIds::prototype, library->typedArrayPrototype, PropertyNone);

        library->AddFunctionToLibraryObject(typedArrayConstructor, PropertyIds::from, &TypedArrayBase::EntryInfo::From, 1);
        library->AddFunctionToLibraryObject(typedArrayConstructor, PropertyIds::of, &TypedArrayBase::EntryInfo::Of, 0);
        library->AddSpeciesAccessorsToLibraryObject(typedArrayConstructor, &TypedArrayBase::EntryInfo::GetterSymbolSpecies);

        typedArrayConstructor->SetHasNoEnumerableProperties(true);

        return true;
    }